

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::BlockingStrategy::SignalAlertWaitingOnCursor::~SignalAlertWaitingOnCursor
          (SignalAlertWaitingOnCursor *this)

{
  StrategyFixture<disruptor::BlockingStrategy>::~StrategyFixture
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalAlertWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(
        strategy.WaitFor(kFirstSequenceValue, cursor, dependents, alerted));
  });

  std::thread([this]() { strategy.SignalAllWhenBlocking(); }).join();
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  std::thread([this]() {
    alerted.store(true);
    strategy.SignalAllWhenBlocking();
  }).join();

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kAlertedSignal);
}